

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbify.cc
# Opt level: O3

void copy_example_to_adf(cbify *data,example *ec)

{
  uint32_t uVar1;
  vw *pvVar2;
  ulong uVar3;
  example *dst;
  byte *pbVar4;
  unsigned_long *puVar5;
  uint32_t *puVar6;
  bool bVar7;
  char cVar8;
  byte *pbVar9;
  uint64_t *puVar10;
  ulong uVar11;
  feature_index *idx;
  unsigned_long *puVar12;
  example *__range2;
  char local_39;
  example *local_38;
  
  pvVar2 = data->all;
  puVar10 = &(pvVar2->weights).dense_weights._weight_mask;
  puVar6 = &(pvVar2->weights).dense_weights._stride_shift;
  if ((pvVar2->weights).sparse != false) {
    puVar10 = &(pvVar2->weights).sparse_weights._weight_mask;
    puVar6 = &(pvVar2->weights).sparse_weights._stride_shift;
  }
  if ((data->adf_data).num_actions != 0) {
    uVar1 = *puVar6;
    uVar3 = *puVar10;
    uVar11 = 0;
    local_38 = ec;
    do {
      dst = (data->adf_data).ecs.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
            super__Vector_impl_data._M_start[uVar11];
      (*(code *)CB::cb_label)();
      VW::copy_example_data(false,dst,local_38);
      pbVar9 = (dst->super_example_predict).indices._begin;
      pbVar4 = (dst->super_example_predict).indices._end;
      if (pbVar9 != pbVar4) {
        do {
          puVar5 = (dst->super_example_predict).feature_space[*pbVar9].indicies._end;
          for (puVar12 = (dst->super_example_predict).feature_space[*pbVar9].indicies._begin;
              puVar12 != puVar5; puVar12 = puVar12 + 1) {
            *puVar12 = (*puVar12 >> ((byte)uVar1 & 0x3f)) * 0x1b90d09 + uVar11 * 0x49be95 <<
                       ((byte)uVar1 & 0x3f) & uVar3;
          }
          pbVar9 = pbVar9 + 1;
        } while (pbVar9 != pbVar4);
      }
      if (((((dst->tag)._end == (dst->tag)._begin) &&
           ((dst->super_example_predict).indices._end == (dst->super_example_predict).indices._begin
           )) && (bVar7 = CB::ec_is_example_header(dst), !bVar7)) &&
         (cVar8 = (*(code *)PTR_test_label_0030dbd0)(&dst->l), cVar8 != '\0')) {
        local_39 = 'n';
        v_array<char>::push_back(&dst->tag,&local_39);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 < (data->adf_data).num_actions);
  }
  return;
}

Assistant:

void copy_example_to_adf(cbify& data, example& ec)
{
  auto& adf_data = data.adf_data;
  const uint64_t ss = data.all->weights.stride_shift();
  const uint64_t mask = data.all->weights.mask();

  for (size_t a = 0; a < adf_data.num_actions; ++a)
  {
    auto& eca = *adf_data.ecs[a];
    // clear label
    auto& lab = eca.l.cb;
    CB::cb_label.default_label(&lab);

    // copy data
    VW::copy_example_data(false, &eca, &ec);

    // offset indicies for given action
    for (features& fs : eca)
    {
      for (feature_index& idx : fs.indicies)
      {
        idx = ((((idx >> ss) * 28904713) + 4832917 * (uint64_t)a) << ss) & mask;
      }
    }

    // avoid empty example by adding a tag (hacky)
    if (CB_ALGS::example_is_newline_not_header(eca) && CB::cb_label.test_label(&eca.l))
    {
      eca.tag.push_back('n');
    }
  }
}